

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# end.c
# Opt level: O0

void get_valuables(obj *list)

{
  int iVar1;
  int local_20;
  obj *poStack_18;
  int i;
  obj *obj;
  obj *list_local;
  
  for (poStack_18 = list; poStack_18 != (obj *)0x0; poStack_18 = poStack_18->nobj) {
    if (poStack_18->cobj == (obj *)0x0) {
      if (poStack_18->oartifact == '\0') {
        if (poStack_18->oclass == '\x05') {
          iVar1 = poStack_18->otyp + -0xc9;
          if (amulets[iVar1].count == 0) {
            amulets[iVar1].count = (long)poStack_18->quan;
            amulets[iVar1].typ = (int)poStack_18->otyp;
          }
          else {
            amulets[iVar1].count = (long)poStack_18->quan + amulets[iVar1].count;
          }
        }
        else if ((poStack_18->oclass == '\r') && (poStack_18->otyp < 0x20f)) {
          if (poStack_18->otyp < 0x206) {
            local_20 = (int)poStack_18->otyp;
          }
          else {
            local_20 = 0x206;
          }
          local_20 = local_20 + -0x1f0;
          if (gems[local_20].count == 0) {
            gems[local_20].count = (long)poStack_18->quan;
            gems[local_20].typ = (int)poStack_18->otyp;
          }
          else {
            gems[local_20].count = (long)poStack_18->quan + gems[local_20].count;
          }
        }
      }
    }
    else {
      get_valuables(poStack_18->cobj);
    }
  }
  return;
}

Assistant:

static void get_valuables(struct obj *list)
{
    struct obj *obj;
    int i;

    /* find amulets and gems, ignoring all artifacts */
    for (obj = list; obj; obj = obj->nobj)
	if (Has_contents(obj)) {
	    get_valuables(obj->cobj);
	} else if (obj->oartifact) {
	    continue;
	} else if (obj->oclass == AMULET_CLASS) {
	    i = obj->otyp - FIRST_AMULET;
	    if (!amulets[i].count) {
		amulets[i].count = obj->quan;
		amulets[i].typ = obj->otyp;
	    } else amulets[i].count += obj->quan; /* always adds one */
	} else if (obj->oclass == GEM_CLASS && obj->otyp < LUCKSTONE) {
	    i = min(obj->otyp, LAST_GEM + 1) - FIRST_GEM;
	    if (!gems[i].count) {
		gems[i].count = obj->quan;
		gems[i].typ = obj->otyp;
	    } else gems[i].count += obj->quan;
	}
    return;
}